

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall t_d_generator::emit_doc(t_d_generator *this,t_doc *doc,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ostream *out_local;
  t_doc *doc_local;
  t_d_generator *this_local;
  
  bVar1 = t_doc::has_doc(doc);
  if (bVar1) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"/**");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    psVar3 = t_doc::get_doc_abi_cxx11_(doc);
    std::operator<<(poVar2,(string *)psVar3);
    t_generator::indent_down((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"*/");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void emit_doc(t_doc *doc, std::ostream& out) {
    if (!doc->has_doc()) {
      return;
    }
    indent(out) << "/**" << std::endl;
    indent_up();
    // No endl -- comments reliably have a newline at the end.
    // This is true even for stuff like:
    //     /** method infos */ void foo(/** huh?*/ 1: i64 stuff)
    indent(out) << doc->get_doc();
    indent_down();
    indent(out) << "*/" << std::endl;
  }